

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

bool __thiscall
QCache<QPixmapCache::Key,_QPixmapCacheEntry>::insert
          (QCache<QPixmapCache::Key,_QPixmapCacheEntry> *this,Key *key,QPixmapCacheEntry *object,
          qsizetype cost)

{
  long lVar1;
  Chain *pCVar2;
  Chain *pCVar3;
  Chain *pCVar4;
  long lVar5;
  long in_FS_OFFSET;
  Key local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->mx;
  if (lVar1 < cost) {
    remove(this,(char *)key);
    if (object != (QPixmapCacheEntry *)0x0) {
      (*(object->super_QPixmap).super_QPaintDevice._vptr_QPaintDevice[1])(object);
    }
  }
  else {
    trim(this,lVar1 - cost);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::
    findOrInsert<QPixmapCache::Key>((InsertionResult *)local_58,&this->d,key);
    pCVar4 = (Chain *)((((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries)->
                       storage).data +
                      (uint)(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                            [(uint)local_58._8_8_ & 0x7f] * 0x28);
    if (local_58[0x10] == true) {
      pCVar2 = pCVar4[1].next;
      pCVar3 = pCVar4[2].prev;
      pCVar4[1].next = (Chain *)object;
      pCVar4[2].prev = (Chain *)cost;
      if (pCVar2 != (Chain *)0x0) {
        (*(code *)pCVar2->prev->next)();
      }
      relink(this,key);
      lVar5 = cost - (long)pCVar3;
    }
    else {
      QPixmapCache::Key::Key(&local_60,key);
      pCVar4->prev = pCVar4;
      pCVar4->next = pCVar4;
      pCVar4[1].prev = (Chain *)local_60.d;
      local_60.d = (KeyData *)0x0;
      pCVar4[1].next = (Chain *)object;
      pCVar4[2].prev = (Chain *)cost;
      QPixmapCache::Key::~Key(&local_60);
      pCVar4->prev = &this->chain;
      pCVar2 = (this->chain).next;
      pCVar4->next = pCVar2;
      pCVar2->prev = pCVar4;
      (this->chain).next = pCVar4;
      lVar5 = cost;
    }
    this->total = this->total + lVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cost <= lVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool insert(const Key &key, T *object, qsizetype cost = 1)
    {
        if (cost > mx) {
            remove(key);
            delete object;
            return false;
        }
        trim(mx - cost);
        auto result = d.findOrInsert(key);
        Node *n = result.it.node();
        if (result.initialized) {
            auto prevCost = n->value.cost;
            result.it.node()->emplace(object, cost);
            cost -= prevCost;
            relink(key);
        } else {
            Node::createInPlace(n, key, object, cost);
            n->prev = &chain;
            n->next = chain.next;
            chain.next->prev = n;
            chain.next = n;
        }
        total += cost;
        return true;
    }